

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgGeneratorState.hpp
# Opt level: O3

float rsg::NotEqualOp::getWeight(GeneratorState *state,ConstValueRangeAccess valueRange)

{
  int iVar1;
  int iVar2;
  float fVar3;
  
  if (state->m_programParams->useComparisonOps == true) {
    if (((valueRange.m_type)->m_baseType == TYPE_VOID) ||
       (((valueRange.m_type)->m_baseType == TYPE_BOOL && ((valueRange.m_type)->m_numElements == 1)))
       ) {
      fVar3 = 0.0;
      if (7 < (state->m_precedenceStack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish[-1]) {
        iVar2 = state->m_shaderParams->maxExpressionDepth - state->m_expressionDepth;
        if ((valueRange.m_type)->m_baseType == TYPE_VOID) {
          if (1 < iVar2) {
            fVar3 = 0.05;
          }
        }
        else {
          iVar1 = getConservativeValueExprDepth(state,valueRange);
          fVar3 = 0.0;
          if (iVar1 + 1 <= iVar2) {
            fVar3 = 1.0;
          }
        }
      }
      return fVar3;
    }
  }
  return 0.0;
}

Assistant:

const ProgramParameters&	getProgramParameters		(void) const	{ return m_programParams;	}